

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O0

void __thiscall
duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLS::~AESStateMBEDTLS(AESStateMBEDTLS *this)

{
  bool bVar1;
  EncryptionState *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__AESStateMBEDTLS_00a1d0b0;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
                      *)0x855b6a);
  if (bVar1) {
    std::unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>::get
              ((unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
                *)in_RDI);
    mbedtls_cipher_free((mbedtls_cipher_context_t *)0x855b86);
  }
  duckdb::unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>,_true>
  ::~unique_ptr((unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>,_true>
                 *)0x855b98);
  duckdb::EncryptionState::~EncryptionState(in_RDI);
  return;
}

Assistant:

MbedTlsWrapper::AESStateMBEDTLS::~AESStateMBEDTLS() {
	if (context) {
		mbedtls_cipher_free(context.get());
	}
}